

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void * xmlHashQLookup3(xmlHashTablePtr hash,xmlChar *prefix,xmlChar *name,xmlChar *prefix2,
                      xmlChar *name2,xmlChar *prefix3,xmlChar *name3)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  xmlHashEntry *pxVar10;
  uint uVar11;
  
  if (hash == (xmlHashTablePtr)0x0) {
    return (void *)0x0;
  }
  if (name != (xmlChar *)0x0 && hash->size != 0) {
    uVar6 = hash->randomSeed;
    uVar2 = uVar6 ^ 0x3b00;
    uVar6 = uVar6 << 0xf | uVar6 >> 0x11;
    if (prefix != (xmlChar *)0x0) {
      bVar9 = *prefix;
      if (bVar9 != 0) {
        pbVar5 = prefix + 1;
        do {
          uVar2 = (bVar9 + uVar2) * 9;
          uVar6 = ((uVar6 + uVar2) * 0x80 | uVar6 + uVar2 >> 0x19) * 5;
          bVar9 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        } while (bVar9 != 0);
      }
      iVar3 = uVar2 * 9;
      uVar2 = uVar2 * 9 + 0x20a;
      uVar6 = iVar3 + uVar6 + 0x20a;
      uVar6 = (uVar6 * 0x80 | uVar6 >> 0x19) * 5;
    }
    bVar9 = *name;
    if (bVar9 != 0) {
      pbVar5 = name + 1;
      do {
        uVar2 = (bVar9 + uVar2) * 9;
        uVar6 = ((uVar6 + uVar2) * 0x80 | uVar6 + uVar2 >> 0x19) * 5;
        bVar9 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar9 != 0);
    }
    iVar3 = uVar2 * 9;
    iVar7 = ((uVar6 + iVar3) * 0x80 | uVar6 + iVar3 >> 0x19) * 5;
    if (prefix2 != (xmlChar *)0x0) {
      bVar9 = *prefix2;
      if (bVar9 != 0) {
        pbVar5 = prefix2 + 1;
        do {
          iVar3 = ((uint)bVar9 + iVar3) * 9;
          iVar7 = ((iVar7 + iVar3) * 0x80 | (uint)(iVar7 + iVar3) >> 0x19) * 5;
          bVar9 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        } while (bVar9 != 0);
      }
      iVar1 = iVar3 * 9;
      iVar3 = iVar3 * 9 + 0x20a;
      uVar6 = iVar1 + iVar7 + 0x20a;
      iVar7 = (uVar6 * 0x80 | uVar6 >> 0x19) * 5;
    }
    if ((name2 != (xmlChar *)0x0) && (bVar9 = *name2, bVar9 != 0)) {
      pbVar5 = name2 + 1;
      do {
        iVar3 = ((uint)bVar9 + iVar3) * 9;
        iVar7 = ((iVar7 + iVar3) * 0x80 | (uint)(iVar7 + iVar3) >> 0x19) * 5;
        bVar9 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar9 != 0);
    }
    uVar6 = iVar3 * 9;
    uVar2 = ((iVar7 + uVar6) * 0x80 | iVar7 + uVar6 >> 0x19) * 5;
    if (prefix3 != (xmlChar *)0x0) {
      bVar9 = *prefix3;
      if (bVar9 != 0) {
        pbVar5 = prefix3 + 1;
        do {
          uVar6 = (bVar9 + uVar6) * 9;
          uVar2 = ((uVar2 + uVar6) * 0x80 | uVar2 + uVar6 >> 0x19) * 5;
          bVar9 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        } while (bVar9 != 0);
      }
      iVar3 = uVar6 * 9;
      uVar6 = uVar6 * 9 + 0x20a;
      uVar2 = iVar3 + uVar2 + 0x20a;
      uVar2 = (uVar2 * 0x80 | uVar2 >> 0x19) * 5;
    }
    if (name3 != (xmlChar *)0x0) {
      bVar9 = *name3;
      pbVar5 = name3;
      while (bVar9 != 0) {
        pbVar5 = pbVar5 + 1;
        uVar6 = (bVar9 + uVar6) * 9;
        uVar2 = ((uVar2 + uVar6) * 0x80 | uVar2 + uVar6 >> 0x19) * 5;
        bVar9 = *pbVar5;
      }
    }
    uVar4 = (uVar2 << 0xe | uVar2 >> 0x12) + (uVar6 ^ uVar2);
    uVar6 = (uVar4 * 0x4000000 | uVar4 >> 6) + (uVar2 ^ uVar4);
    uVar2 = (uVar6 * 0x20 | uVar6 >> 0x1b) + (uVar4 ^ uVar6);
    uVar11 = (uVar2 * 0x1000000 | uVar2 >> 8) + (uVar6 ^ uVar2);
    uVar2 = hash->size - 1;
    uVar4 = uVar11 & uVar2;
    uVar6 = hash->table[uVar4].hashValue;
    if (uVar6 == 0) {
      return (void *)0x0;
    }
    pxVar10 = hash->table + uVar4;
    uVar8 = 0;
    do {
      uVar4 = uVar4 + 1;
      if (((((uVar11 | 0x80000000) == uVar6) &&
           (iVar3 = xmlStrQEqual(prefix,name,pxVar10->key), iVar3 != 0)) &&
          (iVar3 = xmlStrQEqual(prefix2,name2,pxVar10->key2), iVar3 != 0)) &&
         (iVar3 = xmlStrQEqual(prefix3,name3,pxVar10->key3), iVar3 != 0)) {
        return pxVar10->payload;
      }
      if ((uVar4 & uVar2) == 0) {
        pxVar10 = hash->table;
      }
      else {
        pxVar10 = pxVar10 + 1;
      }
      uVar6 = pxVar10->hashValue;
    } while ((uVar6 != 0) && (uVar8 = uVar8 + 1, uVar8 <= (uVar4 - uVar6 & uVar2)));
  }
  return (void *)0x0;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
void *
xmlHashQLookup3(xmlHashTablePtr hash,
                const xmlChar *prefix, const xmlChar *name,
                const xmlChar *prefix2, const xmlChar *name2,
                const xmlChar *prefix3, const xmlChar *name3) {
    const xmlHashEntry *entry;
    unsigned hashValue, mask, pos, displ;

    if ((hash == NULL) || (hash->size == 0) || (name == NULL))
        return(NULL);

    hashValue = xmlHashQNameValue(hash->randomSeed, prefix, name, prefix2,
                                  name2, prefix3, name3);
    mask = hash->size - 1;
    pos = hashValue & mask;
    entry = &hash->table[pos];

    if (entry->hashValue != 0) {
        displ = 0;
        hashValue |= MAX_HASH_SIZE;

        do {
            if ((hashValue == entry->hashValue) &&
                (xmlStrQEqual(prefix, name, entry->key)) &&
                (xmlStrQEqual(prefix2, name2, entry->key2)) &&
                (xmlStrQEqual(prefix3, name3, entry->key3)))
                return(entry->payload);

            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = hash->table;
        } while ((entry->hashValue != 0) &&
                 (((pos - entry->hashValue) & mask) >= displ));
    }

    return(NULL);
}